

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebugStateSaverPrivate::restoreState(QDebugStateSaverPrivate *this)

{
  bool bVar1;
  _Head_base<0UL,_QTextStreamPrivate_*,_false> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  Stream *pSVar8;
  
  pSVar8 = this->m_stream;
  bVar1 = pSVar8->space;
  if ((bVar1 == true) && (this->m_spaces == false)) {
    bVar7 = QString::endsWith(&pSVar8->buffer,(QChar)0x20,CaseSensitive);
    pSVar8 = this->m_stream;
    if (bVar7) {
      QString::chop(&pSVar8->buffer,1);
      pSVar8 = this->m_stream;
    }
  }
  pSVar8->space = this->m_spaces;
  pSVar8->noQuotes = this->m_noQuotes;
  _Var2._M_head_impl =
       (pSVar8->ts).d_ptr._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  iVar5 = (this->m_streamParams).realNumberPrecision;
  iVar6 = (this->m_streamParams).integerBase;
  uVar3 = *(undefined8 *)&(this->m_streamParams).fieldWidth;
  uVar4 = *(undefined8 *)&(this->m_streamParams).realNumberNotation;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->params + 0xc) =
       *(undefined8 *)&(this->m_streamParams).padChar;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->params + 0x14) = uVar4;
  ((_Var2._M_head_impl)->params).realNumberPrecision = iVar5;
  ((_Var2._M_head_impl)->params).integerBase = iVar6;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->params + 8) = uVar3;
  pSVar8 = this->m_stream;
  pSVar8->verbosity = this->m_verbosity;
  if ((bVar1 == false) && (this->m_spaces == true)) {
    QTextStream::operator<<(&pSVar8->ts,' ');
    return;
  }
  return;
}

Assistant:

void restoreState()
    {
        const bool currentSpaces = m_stream->space;
        if (currentSpaces && !m_spaces)
            if (m_stream->buffer.endsWith(u' '))
                m_stream->buffer.chop(1);

        m_stream->space = m_spaces;
        m_stream->noQuotes = m_noQuotes;
        m_stream->ts.d_ptr->params = m_streamParams;
        m_stream->verbosity = m_verbosity;

        if (!currentSpaces && m_spaces)
            m_stream->ts << ' ';
    }